

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void negotiate(connectdata *conn)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  
  pvVar2 = (conn->data->req).protop;
  lVar4 = 0;
  do {
    if (lVar4 != 1) {
      if (*(int *)((long)pvVar2 + lVar4 * 4 + 0x808) == 1) {
        pvVar3 = (conn->data->req).protop;
        iVar1 = *(int *)((long)pvVar3 + lVar4 * 4 + 8);
        if (iVar1 == 3) {
          if (*(int *)((long)pvVar3 + lVar4 * 4 + 0x408) == 0) {
            *(undefined4 *)((long)pvVar3 + lVar4 * 4 + 0x408) = 1;
          }
        }
        else if (iVar1 == 2) {
          if (*(int *)((long)pvVar3 + lVar4 * 4 + 0x408) == 1) {
            *(undefined4 *)((long)pvVar3 + lVar4 * 4 + 0x408) = 0;
          }
        }
        else if (iVar1 == 0) {
          *(undefined4 *)((long)pvVar3 + lVar4 * 4 + 8) = 2;
          send_negotiation(conn,0xfb,(int)lVar4);
        }
      }
      if (*(int *)((long)pvVar2 + lVar4 * 4 + 0x1408) == 1) {
        pvVar3 = (conn->data->req).protop;
        iVar1 = *(int *)((long)pvVar3 + lVar4 * 4 + 0xc08);
        if (iVar1 == 3) {
          if (*(int *)((long)pvVar3 + lVar4 * 4 + 0x1008) == 0) {
            *(undefined4 *)((long)pvVar3 + lVar4 * 4 + 0x1008) = 1;
          }
        }
        else if (iVar1 == 2) {
          if (*(int *)((long)pvVar3 + lVar4 * 4 + 0x1008) == 1) {
            *(undefined4 *)((long)pvVar3 + lVar4 * 4 + 0x1008) = 0;
          }
        }
        else if (iVar1 == 0) {
          *(undefined4 *)((long)pvVar3 + lVar4 * 4 + 0xc08) = 2;
          send_negotiation(conn,0xfd,(int)lVar4);
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x28);
  return;
}

Assistant:

static void negotiate(struct connectdata *conn)
{
  int i;
  struct TELNET *tn = (struct TELNET *) conn->data->req.protop;

  for(i = 0; i < CURL_NTELOPTS; i++) {
    if(i == CURL_TELOPT_ECHO)
      continue;

    if(tn->us_preferred[i] == CURL_YES)
      set_local_option(conn, i, CURL_YES);

    if(tn->him_preferred[i] == CURL_YES)
      set_remote_option(conn, i, CURL_YES);
  }
}